

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 08.cpp
# Opt level: O3

int main(void)

{
  size_t sVar1;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  char x;
  char eme [8];
  char local_19;
  char local_18 [8];
  
  setlocale(6," ");
  builtin_strncpy(local_18,"\x1b[1;36m",8);
  sVar1 = strlen(local_18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_18,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"sobre os livros de Nietzsche para cada alternativa digite: ",
             0x3b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "---------------------------------------------------------------------",0x45);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"(a) Se o trecho se referir ao Livro Aurora.",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"(w) se o trecho se referir ao livro um problema para musicos.",
             0x3d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"(z) Se o trecho se referir ao livro Assim Falou Zaratustra.",
             0x3b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"(b) Se o trecho se referir ao livro Wagner em Bayreuth.",0x37);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "----------------------------------------------------------------------",0x46);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Como nos fazem bem as tardes bronzeas da sua felicidade ",0x38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Olhamos pra fora ao ouvi-la: Ja vimos o mar tao liso? ",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"E como a danca moura nos fala de modo tranquilizador! ",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"como, em sua lasciva melancolia, mesmo a nossa insaciabilidade "
             ,0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"aprende a satisfacao!",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Digite o caracter correspondente ao livro que cita esse trecho: ",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,&local_19);
  if (local_19 == 'w') {
    pcVar4 = "Excelente!Caminhemos para o proximo destino!";
    lVar3 = 0x2c;
  }
  else {
    pcVar4 = anon_var_dwarf_a17;
    lVar3 = 0x41;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "----------------------------------------------------------------------------",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Temos que aprender a pensar de outra forma- para enfim, ",0x38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"talvez bem mais tarde, sentir de outra forma!",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Digite o caracter correspondente ao livro que cita esse trecho: ",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,&local_19);
  if (local_19 == 'a') {
    pcVar4 = "Bravo!!Hoje nasceu uma aurora!";
    lVar3 = 0x1e;
  }
  else {
    pcVar4 = "Noopz. Esse trecho foi retirado do livro \'Aurora\'(p.75)!";
    lVar3 = 0x38;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-----------------------------------------------------------------------------",0x4d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Nenhum pastor e um so rebanho! Todos querem o mesmo, ",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"todos sao iguais: O que pensa de outro modo tende a ir ",0x37);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"para o manicomio.",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Digite o caracter correspondente ao livro que cita esse trecho: ",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,&local_19);
  if (local_19 == 'z') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"YESS!Parabens! Es um dos que participa efetivamente do ",0x37)
    ;
    pcVar4 = "preambulo de zaratustra!";
    lVar3 = 0x18;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Noopz! Esse trecho foi retirado do livro \'Assim falou zaratustra\'",0x41);
    pcVar4 = "Da primeira parte do preambulo(p.29)";
    lVar3 = 0x24;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "------------------------------------------------------------------------------",0x4e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"A Liberdade nao eh algo que recebemos como se fosse uma dadiva "
             ,0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "o homem livre se faz por si mesmo ao se confrontar com perguntas ",0x41);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "sobre o sentido de sua existencia e, perceber que ninguem, a nao ser ",0x45);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ele proprio, pode responde-las!",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Digite o caracter correspondente ao livro que cita esse trecho: ",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,&local_19);
  if (local_19 == 'b') {
    pcVar4 = "Em Bayreuth e em qualquer lugar voce estara certo!";
    lVar3 = 0x32;
  }
  else {
    pcVar4 = "Esse trecho foi retirado do livro Wagner em Bayreuth(p.25).";
    lVar3 = 0x3b;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "--------------------------------------------------------------------------------",0x50
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Ai, aproxima-se o tempo que o homem nao dara a luz a estrelas; "
             ,0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"aproxima-se o tempo do mais desprezivel dos homens; ",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Do que ja nao pode desprezar a si mesmo!",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Digite o caracter correspondente ao livro que cita esse trecho: ",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,&local_19);
  if (local_19 == 'z') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Yes! Talvez tu sejas o ultimo homem! Talvez! ",0x2d);
    pcVar4 = "Avante!";
    lVar3 = 7;
  }
  else {
    pcVar4 = "Noopz. Esse trexo foi retirado do livro \'Assim falou zaratustra(p.28)\'";
    lVar3 = 0x46;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Como soam bem a musica ruim e os maus motivos Quando marchamos sobre um inimigo",0x4f)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Digite o caracter correspondente ao livro que cita esse trecho: ",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,&local_19);
  if (local_19 == 'a') {
    pcVar4 = "YESS!";
    lVar3 = 5;
  }
  else {
    pcVar4 = "Nao. Esse trexo foi retirado do livro \'Aurora\'.";
    lVar3 = 0x2f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  system("pause");
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, " ");
    char eme[] = {0x1b, '[', '1', ';', '3', '6', 'm', 0};
    cout << eme;

    const char a = 'a';
    const char w = 'w';
    const char z = 'z';
    const char b = 'b';
    char x;

    cout << "sobre os livros de Nietzsche para cada alternativa digite: " << endl;
    cout << "---------------------------------------------------------------------" << endl;
    cout << "(a) Se o trecho se referir ao Livro Aurora." << endl;
    cout << "(w) se o trecho se referir ao livro um problema para musicos." << endl;
    cout << "(z) Se o trecho se referir ao livro Assim Falou Zaratustra." << endl;
    cout << "(b) Se o trecho se referir ao livro Wagner em Bayreuth." << endl;
    cout << "----------------------------------------------------------------------" << endl;

    cout << "Como nos fazem bem as tardes bronzeas da sua felicidade ";
    cout << "Olhamos pra fora ao ouvi-la: Ja vimos o mar tao liso? ";
    cout << "E como a danca moura nos fala de modo tranquilizador! ";
    cout << "como, em sua lasciva melancolia, mesmo a nossa insaciabilidade ";
    cout << "aprende a satisfacao!" << endl;
    cout << "Digite o caracter correspondente ao livro que cita esse trecho: " << endl;
    cin >> x;

    if (x == w)
    {
        cout << "Excelente!Caminhemos para o proximo destino!" << endl;
    }
    else
    {
        cout << "Noopz.Esse trecho eh do livro 'Um problema para musicos'(pág.13)" << endl;
    }

    cout << "----------------------------------------------------------------------------" << endl;
    cout << "Temos que aprender a pensar de outra forma- para enfim, ";
    cout << "talvez bem mais tarde, sentir de outra forma!" << endl;
    cout << "Digite o caracter correspondente ao livro que cita esse trecho: " << endl;
    cin >> x;

    if (x == a)
    {
        cout << "Bravo!!Hoje nasceu uma aurora!" << endl;
    }
    else
    {
        cout << "Noopz. Esse trecho foi retirado do livro 'Aurora'(p.75)!" << endl;
    }

    cout << "-----------------------------------------------------------------------------" << endl;
    cout << "Nenhum pastor e um so rebanho! Todos querem o mesmo, ";
    cout << "todos sao iguais: O que pensa de outro modo tende a ir ";
    cout << "para o manicomio.";
    cout << "Digite o caracter correspondente ao livro que cita esse trecho: " << endl;
    cin >> x;

    if (x == z)
    {
        cout << "YESS!Parabens! Es um dos que participa efetivamente do ";
        cout << "preambulo de zaratustra!" << endl;
    }
    else
    {
        cout << "Noopz! Esse trecho foi retirado do livro 'Assim falou zaratustra'";
        cout << "Da primeira parte do preambulo(p.29)" << endl;
    }

    cout << "------------------------------------------------------------------------------" << endl;
    cout << "A Liberdade nao eh algo que recebemos como se fosse uma dadiva ";
    cout << "o homem livre se faz por si mesmo ao se confrontar com perguntas ";
    cout << "sobre o sentido de sua existencia e, perceber que ninguem, a nao ser ";
    cout << "ele proprio, pode responde-las!" << endl;
    cout << "Digite o caracter correspondente ao livro que cita esse trecho: " << endl;
    cin >> x;

    if (x == b)
    {
        cout << "Em Bayreuth e em qualquer lugar voce estara certo!" << endl;
    }
    else
    {
        cout << "Esse trecho foi retirado do livro Wagner em Bayreuth(p.25)." << endl;
    }

    cout << "--------------------------------------------------------------------------------" << endl;
    cout << "Ai, aproxima-se o tempo que o homem nao dara a luz a estrelas; ";
    cout << "aproxima-se o tempo do mais desprezivel dos homens; ";
    cout << "Do que ja nao pode desprezar a si mesmo!" << endl;
    cout << "Digite o caracter correspondente ao livro que cita esse trecho: " << endl;
    cin >> x;

    if (x == z)
    {
        cout << "Yes! Talvez tu sejas o ultimo homem! Talvez! ";
        cout << "Avante!";
    }
    else
    {
        cout << "Noopz. Esse trexo foi retirado do livro 'Assim falou zaratustra(p.28)'";
    }
    cout << endl
         << endl;
    cout << "Como soam bem a musica ruim e os maus motivos Quando marchamos sobre um inimigo" << endl;
    cout << "Digite o caracter correspondente ao livro que cita esse trecho: " << endl;
    cin >> x;

    if (x == a)
    {
        cout << "YESS!" << endl;
    }
    else
    {
        cout << "Nao. Esse trexo foi retirado do livro 'Aurora'." << endl;
    }

    system("pause");
    return 0;
}